

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_soup_mesh_builder.cc
# Opt level: O0

void __thiscall
draco::TriangleSoupMeshBuilder::SetAttributeValuesForFace
          (TriangleSoupMeshBuilder *this,int att_id,FaceIndex face_id,void *corner_value_0,
          void *corner_value_1,void *corner_value_2)

{
  pointer face;
  reference pvVar1;
  int in_ESI;
  Mesh *in_RDI;
  PointAttribute *att;
  int start_index;
  int32_t in_stack_ffffffffffffff6c;
  PointCloud *in_stack_ffffffffffffff70;
  void *in_stack_ffffffffffffff90;
  FaceIndex in_stack_ffffffffffffffa4;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IStack_58;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> aIStack_54 [2];
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_4c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_48;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_44;
  PointAttribute *local_40;
  uint local_34;
  int local_14;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_4;
  
  local_14 = in_ESI;
  local_34 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(&local_4);
  local_34 = local_34 * 3;
  std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::operator->
            ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)0x19378b);
  local_40 = PointCloud::attribute(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_44,local_34);
  GeometryAttribute::SetAttributeValue
            ((GeometryAttribute *)in_RDI,(AttributeValueIndex)in_stack_ffffffffffffffa4.value_,
             in_stack_ffffffffffffff90);
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_48,local_34 + 1);
  GeometryAttribute::SetAttributeValue
            ((GeometryAttribute *)in_RDI,(AttributeValueIndex)in_stack_ffffffffffffffa4.value_,
             in_stack_ffffffffffffff90);
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_4c,local_34 + 2);
  GeometryAttribute::SetAttributeValue
            ((GeometryAttribute *)in_RDI,(AttributeValueIndex)in_stack_ffffffffffffffa4.value_,
             in_stack_ffffffffffffff90);
  face = std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::operator->
                   ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)0x193834);
  IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType
            ((IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)&stack0xffffffffffffffa4,
             local_34);
  IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(&IStack_58,local_34 + 1);
  IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(aIStack_54,local_34 + 2);
  Mesh::SetFace(in_RDI,in_stack_ffffffffffffffa4,(Face *)face);
  pvVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                     ((vector<signed_char,_std::allocator<signed_char>_> *)in_RDI,(long)local_14);
  *pvVar1 = '\x01';
  return;
}

Assistant:

void TriangleSoupMeshBuilder::SetAttributeValuesForFace(
    int att_id, FaceIndex face_id, const void *corner_value_0,
    const void *corner_value_1, const void *corner_value_2) {
  const int start_index = 3 * face_id.value();
  PointAttribute *const att = mesh_->attribute(att_id);
  att->SetAttributeValue(AttributeValueIndex(start_index), corner_value_0);
  att->SetAttributeValue(AttributeValueIndex(start_index + 1), corner_value_1);
  att->SetAttributeValue(AttributeValueIndex(start_index + 2), corner_value_2);
  mesh_->SetFace(face_id,
                 {{PointIndex(start_index), PointIndex(start_index + 1),
                   PointIndex(start_index + 2)}});
  attribute_element_types_[att_id] = MESH_CORNER_ATTRIBUTE;
}